

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::connection<websocketpp::config::asio_client>::log_err<std::error_code>
          (connection<websocketpp::config::asio_client> *this,level l,char *msg,error_code *ec)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this_00;
  size_t sVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  error_code *__n;
  stringstream s;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  __n = ec;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (msg == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,msg,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," error: ",8);
  pbVar2 = std::operator<<((ostream *)local_1a0,ec);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar2," (",2);
  (**(code **)(*(long *)ec->_M_cat + 0x20))(&local_1d0,ec->_M_cat,ec->_M_value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(pbVar2,(char *)local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  this_00 = (this->m_elog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            (this_00,l,&local_1d0,(size_t)__n);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void log_err(log::level l, char const * msg, error_type const & ec) {
        std::stringstream s;
        s << msg << " error: " << ec << " (" << ec.message() << ")";
        m_elog->write(l, s.str());
    }